

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QPoint __thiscall QAccessiblePlainTextEdit::scrollBarPosition(QAccessiblePlainTextEdit *this)

{
  long lVar1;
  QScrollBar *pQVar2;
  QPoint QVar3;
  long in_FS_OFFSET;
  QPoint result;
  int in_stack_ffffffffffffffcc;
  QPoint *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QPoint::QPoint(in_stack_ffffffffffffffd0);
  plainTextEdit((QAccessiblePlainTextEdit *)0x7e3715);
  pQVar2 = QAbstractScrollArea::horizontalScrollBar
                     ((QAbstractScrollArea *)in_stack_ffffffffffffffd0);
  if (pQVar2 != (QScrollBar *)0x0) {
    plainTextEdit((QAccessiblePlainTextEdit *)0x7e372d);
    QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffffd0);
    QAbstractSlider::sliderPosition((QAbstractSlider *)in_stack_ffffffffffffffd0);
  }
  QPoint::setX(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  plainTextEdit((QAccessiblePlainTextEdit *)0x7e3763);
  pQVar2 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffffd0);
  if (pQVar2 != (QScrollBar *)0x0) {
    plainTextEdit((QAccessiblePlainTextEdit *)0x7e377b);
    QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)in_stack_ffffffffffffffd0);
    QAbstractSlider::sliderPosition((QAbstractSlider *)in_stack_ffffffffffffffd0);
  }
  QPoint::setY(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar3.xp.m_i = -0x55555556;
  QVar3.yp.m_i = -0x55555556;
  return QVar3;
}

Assistant:

QPoint QAccessiblePlainTextEdit::scrollBarPosition() const
{
    QPoint result;
    result.setX(plainTextEdit()->horizontalScrollBar() ? plainTextEdit()->horizontalScrollBar()->sliderPosition() : 0);
    result.setY(plainTextEdit()->verticalScrollBar() ? plainTextEdit()->verticalScrollBar()->sliderPosition() : 0);
    return result;
}